

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::ComputeUnknownFieldsSize
                 (InternalMetadata *metadata,size_t total_size,CachedSize *cached_size)

{
  int desired;
  UnknownFieldSet *unknown_fields;
  size_t sVar1;
  CachedSize *cached_size_local;
  size_t total_size_local;
  InternalMetadata *metadata_local;
  
  unknown_fields =
       InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                 (metadata,UnknownFieldSet::default_instance);
  sVar1 = WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  desired = ToCachedSize(sVar1 + total_size);
  CachedSize::Set(cached_size,desired);
  return sVar1 + total_size;
}

Assistant:

size_t ComputeUnknownFieldsSize(const InternalMetadata& metadata,
                                size_t total_size, CachedSize* cached_size) {
  total_size += WireFormat::ComputeUnknownFieldsSize(
      metadata.unknown_fields<UnknownFieldSet>(
          UnknownFieldSet::default_instance));
  cached_size->Set(ToCachedSize(total_size));
  return total_size;
}